

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O2

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_add_order_mpid *m)

{
  undefined1 auVar1 [48];
  side_type sVar2;
  iterator iVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  order_book *this_00;
  undefined7 uStack_87;
  uint64_t order_book_id;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  
  order_book_id = itch_uatoi(m->OrderBook,6);
  iVar3 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_helix::order_book>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->order_book_id_map)._M_h,&order_book_id);
  if (iVar3.super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>.
      _M_cur != (__node_type *)0x0) {
    this_00 = (order_book *)
              ((long)iVar3.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>
                     ._M_cur + 0x10);
    uVar4 = itch_uatoi(m->OrderReferenceNumber,9);
    uVar5 = itch_uatoi(m->Price,10);
    uVar6 = itch_uatoi(m->Quantity,9);
    sVar2 = itch_side(m->BuySellIndicator);
    auVar1._25_7_ = uStack_87;
    auVar1[0x18] = sVar2;
    auVar1._8_8_ = uVar5;
    auVar1._0_8_ = uVar4;
    auVar1._16_8_ = uVar6 & 0xffffffff;
    auVar1._32_8_ = this->time_sec * 1000 + this->time_msec;
    auVar1._40_8_ = 0;
    order_book::add(this_00,(order)(auVar1 << 0x40));
    local_70 = (undefined1  [8])uVar4;
    local_68._M_p = (pointer)this_00;
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,helix::order_book&>,std::allocator<std::pair<unsigned_long_const,helix::order_book&>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_long_const,helix::order_book&>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,helix::order_book&>,std::allocator<std::pair<unsigned_long_const,helix::order_book&>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->order_id_map);
    uVar4 = this->time_sec * 1000 + this->time_msec;
    *(uint64_t *)
     ((long)iVar3.
            super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>.
            _M_cur + 0x30) = uVar4;
    make_ob_event((event *)local_70,(string *)this_00,uVar4,this_00,0);
    std::function<void_(const_helix::event_&)>::operator()(&this->_process_event,(event *)local_70);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_add_order_mpid* m)
{
    auto order_book_id = itch_uatoi(m->OrderBook, sizeof(m->OrderBook));
    auto it = order_book_id_map.find(order_book_id);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;

        uint64_t order_id = itch_uatoi(m->OrderReferenceNumber, sizeof(m->OrderReferenceNumber));
        uint64_t price    = itch_uatoi(m->Price, sizeof(m->Price));;
        uint32_t quantity = itch_uatoi(m->Quantity, sizeof(m->Quantity));;
        auto     side     = itch_side(m->BuySellIndicator);

        order o{order_id, price, quantity, side, timestamp()};
        ob.add(std::move(o));

        order_id_map.insert({order_id, ob});
        ob.set_timestamp(timestamp());
        _process_event(make_ob_event(ob.symbol(), timestamp(), &ob));
    }
}